

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool change_extension_u8(char *path,char *ext,char *dest)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  _Bool _Var5;
  char fname [260];
  char dir [260];
  char drive [260];
  char acStack_358 [272];
  char local_248 [272];
  char local_138 [264];
  
  _Var5 = false;
  memset(dest,0,0x104);
  if (dest != (char *)0x0 && (ext != (char *)0x0 && path != (char *)0x0)) {
    split_path(path,local_138,local_248,acStack_358,(char *)0x0);
    sVar1 = strlen(local_138);
    sVar2 = strlen(local_248);
    sVar3 = strlen(acStack_358);
    sVar4 = strlen(ext);
    _Var5 = sVar4 + sVar2 + sVar1 + sVar3 + 1 < 0x105;
    if (_Var5) {
      strcpy(dest,local_138);
      strcat(dest,local_248);
      strcat(dest,acStack_358);
      strcat(dest,ext);
    }
  }
  return _Var5;
}

Assistant:

bool change_extension_u8(const char *path, const char *ext, char *dest)
{
	clear_path_string(dest, MAX_PATH);
	if (path == NULL || ext == NULL || dest == NULL)
	{
		return false;
	}
	char drive[MAX_PATH];
	char dir[MAX_PATH];
	char fname[MAX_PATH];
	split_path(path, drive, dir, fname, NULL);
	if (strlen(drive) + strlen(dir) + strlen(fname) + strlen(ext) + 1 > MAX_PATH)
	{
		return false;
	}
	strcat(strcat(strcat(strcpy(dest, drive), dir), fname), ext);
	return true;
}